

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall TargetPropertyEntryFinder::operator()(TargetPropertyEntryFinder *this,string *entry)

{
  bool bVar1;
  size_type __n;
  cmMakefile *mf;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_a8;
  LocationMatcher local_a0;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_98;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_90;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_88;
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *local_80;
  CreateLocation local_78;
  back_insert_iterator<std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 local_58 [8];
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> locations;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string *entry_local;
  TargetPropertyEntryFinder *this_local;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = entry;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  cmSystemTools::ExpandListArgument
            (files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,false);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::vector
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::reserve
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58,__n);
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  local_70 = std::
             back_inserter<std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>
                       ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)
                        local_58);
  mf = cmSourceFileLocation::GetMakefile(this->Needle);
  CreateLocation::CreateLocation(&local_78,mf);
  local_80 = (vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)
             std::
             transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,CreateLocation>
                       (local_60,local_68,local_70,local_78);
  local_90._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::begin
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  local_98._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::end
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  LocationMatcher::LocationMatcher(&local_a0,this->Needle);
  local_88 = std::
             find_if<__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,LocationMatcher>
                       (local_90,local_98,local_a0);
  local_a8._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::end
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  bVar1 = __gnu_cxx::operator!=(&local_88,&local_a8);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::~vector
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return bVar1;
}

Assistant:

bool operator()(std::string const& entry)
  {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    std::vector<cmSourceFileLocation> locations;
    locations.reserve(files.size());
    std::transform(files.begin(), files.end(), std::back_inserter(locations),
                   CreateLocation(this->Needle.GetMakefile()));

    return std::find_if(locations.begin(), locations.end(),
                        LocationMatcher(this->Needle)) != locations.end();
  }